

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

uint Catch::rngSeed(void)

{
  uint uVar1;
  IMutableContext *pIVar2;
  Ptr<const_Catch::IConfig> local_10;
  
  pIVar2 = getCurrentMutableContext();
  (*(pIVar2->super_IContext)._vptr_IContext[6])(&local_10,pIVar2);
  uVar1 = (*((local_10.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])();
  Ptr<const_Catch::IConfig>::~Ptr(&local_10);
  return uVar1;
}

Assistant:

IContext& getCurrentContext() {
        return getCurrentMutableContext();
    }